

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void arm_translate_init_arm(uc_struct_conflict1 *uc)

{
  TCGContext_conflict *s;
  TCGTemp *pTVar1;
  long offset;
  
  s = uc->tcg_ctx;
  offset = 0;
  do {
    pTVar1 = tcg_global_mem_new_internal_arm
                       (s,TCG_TYPE_I32,s->cpu_env,offset,
                        (char *)((long)&regnames_rel + (long)*(int *)((long)&regnames_rel + offset))
                       );
    *(long *)((long)s->cpu_R + offset * 2) = (long)pTVar1 - (long)s;
    offset = offset + 4;
  } while (offset != 0x40);
  pTVar1 = tcg_global_mem_new_internal_arm(s,TCG_TYPE_I32,s->cpu_env,0x208,"CF");
  s->cpu_CF = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_arm(s,TCG_TYPE_I32,s->cpu_env,0x210,"NF");
  s->cpu_NF = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_arm(s,TCG_TYPE_I32,s->cpu_env,0x20c,"VF");
  s->cpu_VF = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_arm(s,TCG_TYPE_I32,s->cpu_env,0x214,"ZF");
  s->cpu_ZF = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_arm(s,TCG_TYPE_I64,s->cpu_env,0xec0,"exclusive_addr");
  s->cpu_exclusive_addr = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_arm(s,TCG_TYPE_I64,s->cpu_env,0xec8,"exclusive_val");
  s->cpu_exclusive_val = (TCGv_i64)((long)pTVar1 - (long)s);
  return;
}

Assistant:

void arm_translate_init(struct uc_struct *uc)
{
    TCGContext *tcg_ctx = uc->tcg_ctx;
    int i;

    for (i = 0; i < 16; i++) {
        tcg_ctx->cpu_R[i] = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env,
                                          offsetof(CPUARMState, regs[i]),
                                          regnames[i]);
    }
    tcg_ctx->cpu_CF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, CF), "CF");
    tcg_ctx->cpu_NF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, NF), "NF");
    tcg_ctx->cpu_VF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, VF), "VF");
    tcg_ctx->cpu_ZF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, ZF), "ZF");

    tcg_ctx->cpu_exclusive_addr = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
        offsetof(CPUARMState, exclusive_addr), "exclusive_addr");
    tcg_ctx->cpu_exclusive_val = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
        offsetof(CPUARMState, exclusive_val), "exclusive_val");

    a64_translate_init(uc);
}